

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_x,float default_y)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float fVar4;
  ImVec2 IVar3;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pIVar2 = GImGui;
  fVar6 = size.x;
  fVar4 = size.y;
  if (0.0 <= fVar6) {
    fVar7 = 0.0;
    fVar8 = 0.0;
    if (0.0 <= fVar4) goto LAB_00173c53;
  }
  pIVar1 = GImGui->CurrentWindow;
  IVar3 = GetContentRegionMax();
  fVar7 = (pIVar1->Pos).x + IVar3.x;
  fVar8 = IVar3.y + (pIVar1->Pos).y;
LAB_00173c53:
  fVar5 = fVar6;
  if ((fVar6 <= 0.0) && ((fVar6 != 0.0 || (fVar5 = default_x, NAN(fVar6))))) {
    fVar7 = fVar7 - (pIVar2->CurrentWindow->DC).CursorPos.x;
    if (fVar7 <= 4.0) {
      fVar7 = 4.0;
    }
    fVar5 = fVar7 + fVar6;
  }
  fVar6 = fVar4;
  if ((fVar4 <= 0.0) && ((fVar4 != 0.0 || (fVar6 = default_y, NAN(fVar4))))) {
    fVar8 = fVar8 - (pIVar2->CurrentWindow->DC).CursorPos.y;
    if (fVar8 <= 4.0) {
      fVar8 = 4.0;
    }
    fVar6 = fVar4 + fVar8;
  }
  IVar3.y = fVar6;
  IVar3.x = fVar5;
  return IVar3;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_x, float default_y)
{
    ImGuiContext& g = *GImGui;
    ImVec2 content_max;
    if (size.x < 0.0f || size.y < 0.0f)
        content_max = g.CurrentWindow->Pos + GetContentRegionMax();
    if (size.x <= 0.0f)
        size.x = (size.x == 0.0f) ? default_x : ImMax(content_max.x - g.CurrentWindow->DC.CursorPos.x, 4.0f) + size.x;
    if (size.y <= 0.0f)
        size.y = (size.y == 0.0f) ? default_y : ImMax(content_max.y - g.CurrentWindow->DC.CursorPos.y, 4.0f) + size.y;
    return size;
}